

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
* __thiscall
pybind11::
class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>
::def<unsigned_long(std::vector<ReadPath,std::allocator<ReadPath>>::*)()const>
          (class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>
           *this,char *name_,
          offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr *f)

{
  offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr f_00;
  name *extra;
  cpp_function cf;
  handle local_50;
  cpp_function local_48;
  object local_40;
  sibling local_38;
  is_method local_30;
  PyObject *local_28;
  
  f_00 = *f;
  extra = (name *)f[1];
  local_38.value.m_ptr = *(handle *)this;
  local_40.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_30.class_.m_ptr = (handle)(handle)name_;
  getattr((pybind11 *)&local_50,local_38.value,name_,(PyObject *)&_Py_NoneStruct);
  local_28 = local_50.m_ptr;
  cpp_function::
  cpp_function<unsigned_long,std::vector<ReadPath,std::allocator<ReadPath>>,,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_48,f_00,extra,&local_30,&local_38);
  object::~object((object *)&local_50);
  object::~object(&local_40);
  detail::add_class_method((object *)this,name_,&local_48);
  object::~object((object *)&local_48);
  return (class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
          *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }